

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3AddColumn(Parse *pParse,Token sName,Token sType)

{
  byte bVar1;
  byte bVar2;
  short sVar3;
  Table *pTVar4;
  sqlite3 *db;
  Parse *pParse_00;
  size_t __n;
  char cVar5;
  int iVar6;
  byte *z;
  byte *pbVar7;
  Column *pCVar8;
  size_t sVar9;
  ulong uVar10;
  char *pcVar11;
  long lVar12;
  byte bVar13;
  u8 uVar14;
  u64 n;
  uint uVar15;
  long lVar16;
  long lVar17;
  char **ppcVar18;
  Column *pCol;
  uint uVar19;
  ulong uVar20;
  char local_72;
  u8 local_71;
  Token local_60;
  Parse *local_50;
  Token local_48;
  size_t local_38;
  
  pcVar11 = sType.z;
  local_48.z = sName.z;
  local_48.n = sName.n;
  uVar15 = sType.n;
  pTVar4 = pParse->pNewTable;
  if (pTVar4 != (Table *)0x0) {
    db = pParse->db;
    local_60.z = pcVar11;
    local_60.n = uVar15;
    if (db->aLimit[2] <= (int)pTVar4->nCol) {
      sqlite3ErrorMsg(pParse,"too many columns on %s",pTVar4->zName);
      return;
    }
    local_50 = pParse;
    if (pParse->eParseMode < 2) {
      sqlite3DequoteToken(&local_48);
    }
    if (0xf < uVar15) {
      iVar6 = sqlite3_strnicmp(pcVar11 + (uVar15 - 6),"always",6);
      if (iVar6 == 0) {
        uVar19 = uVar15 - 5;
        uVar10 = (ulong)(uVar15 - 6);
        do {
          if (uVar10 == 0) {
            uVar19 = 0;
            break;
          }
          lVar17 = uVar10 - 1;
          uVar19 = uVar19 - 1;
          uVar10 = uVar10 - 1;
        } while ((""[(byte)pcVar11[lVar17]] & 1) != 0);
        local_60.n = uVar19;
        if (8 < uVar19) {
          iVar6 = sqlite3_strnicmp(pcVar11 + (uVar19 - 9),"generated",9);
          if (iVar6 == 0) {
            local_60.n = uVar19 - 8;
            uVar10 = (ulong)(uVar19 - 9);
            do {
              if (uVar10 == 0) {
                local_60.n = 0;
                break;
              }
              lVar17 = uVar10 - 1;
              local_60.n = local_60.n - 1;
              uVar10 = uVar10 - 1;
            } while ((""[(byte)pcVar11[lVar17]] & 1) != 0);
          }
        }
      }
    }
    local_71 = '\x01';
    if (local_60.n < 3) {
      local_72 = 'A';
      bVar13 = 0;
    }
    else {
      local_72 = 'A';
      sqlite3DequoteToken(&local_60);
      uVar15 = local_60.n;
      pcVar11 = local_60.z;
      bVar13 = 0x10;
      ppcVar18 = sqlite3StdType;
      lVar17 = 0;
      do {
        if ((uVar15 == "\x03\x04\x03\a\x04\x04"[lVar17]) &&
           (iVar6 = sqlite3_strnicmp(pcVar11,*ppcVar18,uVar15), iVar6 == 0)) {
          local_60.n = 0;
          local_72 = "CADDEB"[lVar17];
          local_71 = (((uint)lVar17 & 3) == 1) * '\x04' + '\x01';
          goto LAB_00173329;
        }
        lVar17 = lVar17 + 1;
        bVar13 = bVar13 + 0x10;
        ppcVar18 = ppcVar18 + 1;
      } while (lVar17 != 6);
      bVar13 = 0;
    }
LAB_00173329:
    pParse_00 = local_50;
    uVar10 = (ulong)local_48.n;
    uVar20 = (ulong)local_60.n;
    n = ((uVar20 + uVar10) - (ulong)(uVar20 == 0)) + 2;
    if (db == (sqlite3 *)0x0) {
      z = (byte *)sqlite3Malloc(n);
    }
    else {
      z = (byte *)sqlite3DbMallocRawNN(db,n);
    }
    if (z != (byte *)0x0) {
      if (1 < pParse_00->eParseMode) {
        sqlite3RenameTokenMap(pParse_00,z,&local_48);
      }
      memcpy(z,local_48.z,uVar10);
      z[uVar10] = 0;
      sqlite3Dequote((char *)z);
      bVar1 = *z;
      if (bVar1 == 0) {
        uVar14 = '\0';
      }
      else {
        uVar14 = '\0';
        pbVar7 = z;
        do {
          pbVar7 = pbVar7 + 1;
          uVar14 = uVar14 + ""[bVar1];
          bVar1 = *pbVar7;
        } while (bVar1 != 0);
      }
      lVar17 = (long)pTVar4->nCol;
      if (0 < lVar17) {
        lVar12 = 0;
LAB_001733ec:
        if (pTVar4->aCol[lVar12].hName == uVar14) {
          lVar16 = 0;
          do {
            bVar1 = z[lVar16];
            bVar2 = pTVar4->aCol[lVar12].zCnName[lVar16];
            if (bVar1 == bVar2) {
              if ((ulong)bVar1 == 0) goto LAB_00173428;
            }
            else if (""[bVar1] != ""[bVar2]) goto LAB_00173428;
            lVar16 = lVar16 + 1;
          } while( true );
        }
        goto LAB_00173431;
      }
LAB_00173439:
      local_38 = uVar20;
      pCVar8 = (Column *)sqlite3DbRealloc(db,pTVar4->aCol,lVar17 * 0x10 + 0x10);
      __n = local_38;
      if (pCVar8 == (Column *)0x0) {
LAB_001734f7:
        sqlite3DbFreeNN(db,z);
        return;
      }
      pTVar4->aCol = pCVar8;
      sVar3 = pTVar4->nCol;
      pCol = pCVar8 + sVar3;
      pCVar8[sVar3].zCnName = (char *)0x0;
      *(undefined8 *)&pCVar8[sVar3].field_0x8 = 0;
      pCVar8[sVar3].zCnName = (char *)z;
      pCVar8[sVar3].hName = uVar14;
      if (local_38 == 0) {
        pCol->affinity = local_72;
        pCol->field_0x8 = pCol->field_0x8 & 0xf | bVar13;
        pCol->szEst = local_71;
      }
      else {
        sVar9 = strlen((char *)z);
        uVar10 = (ulong)((uint)sVar9 & 0x3fffffff);
        pbVar7 = z + uVar10 + 1;
        memcpy(pbVar7,local_60.z,__n);
        z[__n + 1 + uVar10] = 0;
        sqlite3Dequote((char *)pbVar7);
        cVar5 = sqlite3AffinityType((char *)pbVar7,pCol);
        pCol->affinity = cVar5;
        *(byte *)&pCol->colFlags = (byte)pCol->colFlags | 4;
      }
      pTVar4->nCol = pTVar4->nCol + 1;
      pTVar4->nNVCol = pTVar4->nNVCol + 1;
      (local_50->constraintName).n = 0;
    }
  }
  return;
LAB_00173428:
  if (bVar1 == bVar2) {
    sqlite3ErrorMsg(pParse_00,"duplicate column name: %s",z);
    goto LAB_001734f7;
  }
LAB_00173431:
  lVar12 = lVar12 + 1;
  if (lVar12 == lVar17) goto LAB_00173439;
  goto LAB_001733ec;
}

Assistant:

SQLITE_PRIVATE void sqlite3AddColumn(Parse *pParse, Token sName, Token sType){
  Table *p;
  int i;
  char *z;
  char *zType;
  Column *pCol;
  sqlite3 *db = pParse->db;
  u8 hName;
  Column *aNew;
  u8 eType = COLTYPE_CUSTOM;
  u8 szEst = 1;
  char affinity = SQLITE_AFF_BLOB;

  if( (p = pParse->pNewTable)==0 ) return;
  if( p->nCol+1>db->aLimit[SQLITE_LIMIT_COLUMN] ){
    sqlite3ErrorMsg(pParse, "too many columns on %s", p->zName);
    return;
  }
  if( !IN_RENAME_OBJECT ) sqlite3DequoteToken(&sName);

  /* Because keywords GENERATE ALWAYS can be converted into indentifiers
  ** by the parser, we can sometimes end up with a typename that ends
  ** with "generated always".  Check for this case and omit the surplus
  ** text. */
  if( sType.n>=16
   && sqlite3_strnicmp(sType.z+(sType.n-6),"always",6)==0
  ){
    sType.n -= 6;
    while( ALWAYS(sType.n>0) && sqlite3Isspace(sType.z[sType.n-1]) ) sType.n--;
    if( sType.n>=9
     && sqlite3_strnicmp(sType.z+(sType.n-9),"generated",9)==0
    ){
      sType.n -= 9;
      while( sType.n>0 && sqlite3Isspace(sType.z[sType.n-1]) ) sType.n--;
    }
  }

  /* Check for standard typenames.  For standard typenames we will
  ** set the Column.eType field rather than storing the typename after
  ** the column name, in order to save space. */
  if( sType.n>=3 ){
    sqlite3DequoteToken(&sType);
    for(i=0; i<SQLITE_N_STDTYPE; i++){
       if( sType.n==sqlite3StdTypeLen[i]
        && sqlite3_strnicmp(sType.z, sqlite3StdType[i], sType.n)==0
       ){
         sType.n = 0;
         eType = i+1;
         affinity = sqlite3StdTypeAffinity[i];
         if( affinity<=SQLITE_AFF_TEXT ) szEst = 5;
         break;
       }
    }
  }

  z = sqlite3DbMallocRaw(db, (i64)sName.n + 1 + (i64)sType.n + (sType.n>0) );
  if( z==0 ) return;
  if( IN_RENAME_OBJECT ) sqlite3RenameTokenMap(pParse, (void*)z, &sName);
  memcpy(z, sName.z, sName.n);
  z[sName.n] = 0;
  sqlite3Dequote(z);
  hName = sqlite3StrIHash(z);
  for(i=0; i<p->nCol; i++){
    if( p->aCol[i].hName==hName && sqlite3StrICmp(z, p->aCol[i].zCnName)==0 ){
      sqlite3ErrorMsg(pParse, "duplicate column name: %s", z);
      sqlite3DbFree(db, z);
      return;
    }
  }
  aNew = sqlite3DbRealloc(db,p->aCol,((i64)p->nCol+1)*sizeof(p->aCol[0]));
  if( aNew==0 ){
    sqlite3DbFree(db, z);
    return;
  }
  p->aCol = aNew;
  pCol = &p->aCol[p->nCol];
  memset(pCol, 0, sizeof(p->aCol[0]));
  pCol->zCnName = z;
  pCol->hName = hName;
  sqlite3ColumnPropertiesFromName(p, pCol);

  if( sType.n==0 ){
    /* If there is no type specified, columns have the default affinity
    ** 'BLOB' with a default size of 4 bytes. */
    pCol->affinity = affinity;
    pCol->eCType = eType;
    pCol->szEst = szEst;
#ifdef SQLITE_ENABLE_SORTER_REFERENCES
    if( affinity==SQLITE_AFF_BLOB ){
      if( 4>=sqlite3GlobalConfig.szSorterRef ){
        pCol->colFlags |= COLFLAG_SORTERREF;
      }
    }
#endif
  }else{
    zType = z + sqlite3Strlen30(z) + 1;
    memcpy(zType, sType.z, sType.n);
    zType[sType.n] = 0;
    sqlite3Dequote(zType);
    pCol->affinity = sqlite3AffinityType(zType, pCol);
    pCol->colFlags |= COLFLAG_HASTYPE;
  }
  p->nCol++;
  p->nNVCol++;
  pParse->constraintName.n = 0;
}